

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::AsyncIoStreamWithGuards::tryPumpFrom(AsyncIoStreamWithGuards *this)

{
  uint64_t in_RDX;
  long in_RSI;
  
  tryPumpFrom(this,(AsyncInputStream *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input,
                                               uint64_t amount = kj::maxValue) override {
    if (writeGuardReleased) {
      return input.pumpTo(*inner, amount);
    } else {
      return writeGuard.addBranch().then([this,&input,amount]() {
        return input.pumpTo(*inner, amount);
      });
    }
  }